

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void FM_STATUS_RESET(FM_ST *ST,int flag)

{
  byte bVar1;
  
  bVar1 = ~(byte)flag & ST->status;
  ST->status = bVar1;
  if ((ST->irq != '\0') && ((ST->irqmask & bVar1) == 0)) {
    ST->irq = '\0';
    if (ST->IRQ_Handler != (FM_IRQHANDLER)0x0) {
      (*ST->IRQ_Handler)(ST->param,'\0');
      return;
    }
  }
  return;
}

Assistant:

INLINE void FM_STATUS_RESET(FM_ST *ST,int flag)
{
	/* reset status flag */
	ST->status &=~flag;
	if ( (ST->irq) && !(ST->status & ST->irqmask) )
	{
		ST->irq = 0;
		/* callback user interrupt handler (IRQ is ON to OFF) */
		if(ST->IRQ_Handler) (ST->IRQ_Handler)(ST->param,0);
	}
}